

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O3

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t _elemsize;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  LRN_x86 *pLVar5;
  pointer piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  allocator_type local_171;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  Mat local_158;
  ulong local_110;
  long local_108;
  void *local_100;
  long local_f8;
  LRN_x86 *local_f0;
  Mat local_e8;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar7 = bottom_top_blob->w;
  local_170 = (ulong)(uint)bottom_top_blob->h;
  uVar8 = bottom_top_blob->c;
  uVar22 = (ulong)uVar8;
  _elemsize = bottom_top_blob->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,uVar7,bottom_top_blob->h,uVar8,_elemsize,opt->workspace_allocator);
  iVar14 = -100;
  if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) goto LAB_00313101;
  iVar20 = (int)local_170 * uVar7;
  if (0 < (int)uVar8) {
    pvVar15 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar18 = 0;
    pvVar10 = local_e8.data;
    do {
      if (0 < iVar20) {
        lVar19 = 0;
        do {
          fVar1 = *(float *)((long)pvVar15 + lVar19 * 4);
          *(float *)((long)pvVar10 + lVar19 * 4) = fVar1 * fVar1;
          lVar19 = lVar19 + 1;
        } while (iVar20 != (int)lVar19);
      }
      uVar18 = uVar18 + 1;
      pvVar15 = (void *)((long)pvVar15 + sVar2 * sVar3);
      pvVar10 = (void *)((long)pvVar10 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar18 != uVar22);
  }
  iVar9 = (this->super_LRN).region_type;
  iVar14 = 0;
  local_f0 = this;
  if (iVar9 == 0) {
    local_168 = CONCAT44(local_168._4_4_,iVar20);
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    Mat::create(&local_158,uVar7,(int)local_170,uVar8,_elemsize,opt->workspace_allocator);
    if ((local_158.data == (void *)0x0) || (local_158.cstep * (long)local_158.c == 0)) {
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
joined_r0x003130db:
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_003130fb:
      iVar14 = -100;
      goto LAB_00313101;
    }
    uVar7 = (int)local_158.cstep * local_158.c;
    if (0 < (int)uVar7) {
      memset(local_158.data,0,(ulong)uVar7 << 2);
    }
    iVar14 = (int)local_168;
    if (0 < (int)uVar8) {
      fVar1 = (local_f0->super_LRN).alpha;
      iVar20 = (local_f0->super_LRN).local_size;
      uVar7 = iVar20 / 2;
      local_170 = (ulong)-uVar7;
      pvVar15 = bottom_top_blob->data;
      local_108 = (long)(int)uVar7;
      local_100 = (void *)(local_158.cstep *
                          CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
      local_f8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      uVar18 = 0;
      pvVar10 = local_158.data;
      local_160 = uVar22;
      do {
        pLVar5 = local_f0;
        uVar8 = (int)local_170 + (int)uVar18;
        if ((long)(int)uVar8 <= (long)(local_108 + uVar18)) {
          lVar19 = local_158.cstep *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) * uVar18;
          do {
            if (uVar8 < (uint)local_160 && 0 < (int)local_168) {
              lVar17 = 0;
              do {
                *(float *)((long)local_158.data + lVar17 * 4 + lVar19) =
                     *(float *)((long)local_158.data + lVar17 * 4 + lVar19) +
                     *(float *)((long)local_e8.data +
                               lVar17 * 4 +
                               (ulong)uVar8 *
                               local_e8.cstep *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                lVar17 = lVar17 + 1;
              } while (iVar14 != (int)lVar17);
            }
            bVar23 = uVar8 != uVar7;
            uVar8 = uVar8 + 1;
          } while (bVar23);
        }
        if (0 < (int)local_168) {
          lVar19 = 0;
          do {
            fVar24 = powf(*(float *)((long)pvVar10 + lVar19 * 4) * fVar1 * (1.0 / (float)iVar20) +
                          (pLVar5->super_LRN).bias,-(pLVar5->super_LRN).beta);
            *(float *)((long)pvVar15 + lVar19 * 4) = fVar24 * *(float *)((long)pvVar15 + lVar19 * 4)
            ;
            lVar19 = lVar19 + 1;
          } while (iVar14 != (int)lVar19);
        }
        uVar7 = uVar7 + 1;
        uVar18 = uVar18 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)local_100);
        pvVar15 = (void *)((long)pvVar15 + local_f8);
      } while (uVar18 != local_160);
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar14 = 0;
    if (piVar4 == (int *)0x0) goto LAB_00313101;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_00313101;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_00313101;
    }
  }
  else {
    if (iVar9 != 1) goto LAB_00313101;
    piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    local_158.data = local_e8.data;
    local_158.refcount._0_4_ = local_e8.refcount._0_4_;
    local_158.refcount._4_4_ = local_e8.refcount._4_4_;
    local_158.elemsize._0_4_ = (undefined4)local_e8.elemsize;
    local_158.elemsize._4_4_ = local_e8.elemsize._4_4_;
    local_158.elempack = local_e8.elempack;
    local_158.allocator = local_e8.allocator;
    local_158.dims = local_e8.dims;
    local_158.w = local_e8.w;
    local_158.h = local_e8.h;
    local_158.d = local_e8.d;
    local_158.c = local_e8.c;
    local_158.cstep = local_e8.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    uVar8 = (this->super_LRN).local_size;
    uVar11 = uVar7;
    if (1 < (int)uVar8) {
      uVar11 = uVar8 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_e8,&local_158,uVar11,~uVar11 + uVar8,uVar11,~uVar11 + uVar8,0,0.0,
                       (Option *)&_space_ofs);
      if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0)) {
        piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_158.allocator == (Allocator *)0x0) goto joined_r0x003130db;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_003130fb;
      }
      uVar8 = (this->super_LRN).local_size;
      uVar11 = local_158.w;
    }
    uVar13 = uVar8 * uVar8;
    fVar1 = (this->super_LRN).alpha;
    local_160 = uVar22;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar13,&local_171);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = (this->super_LRN).local_size;
    if (0 < iVar14) {
      iVar21 = uVar11 - iVar14;
      iVar20 = 0;
      iVar9 = 0;
      iVar12 = 0;
      do {
        if (0 < iVar14) {
          lVar19 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar12 + lVar19] = iVar9 + (int)lVar19;
            iVar14 = (this->super_LRN).local_size;
            lVar19 = lVar19 + 1;
            iVar16 = (int)lVar19;
          } while (iVar16 < iVar14);
          iVar12 = iVar12 + iVar16;
          iVar9 = iVar9 + iVar16;
        }
        iVar9 = iVar9 + iVar21;
        iVar20 = iVar20 + 1;
      } while (iVar20 < iVar14);
    }
    if (0 < (int)local_160) {
      local_f8 = (long)(int)uVar7;
      local_80 = bottom_top_blob->data;
      local_88 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_90 = local_158.data;
      local_98 = local_158.cstep * CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize)
      ;
      local_108 = (long)local_158.w *
                  CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_110 = 0;
      do {
        if (0 < (int)local_170) {
          local_100 = (void *)(local_98 * local_110 + (long)local_90);
          pvVar15 = (void *)(local_88 * local_110 + (long)local_80);
          local_168 = 0;
          do {
            pvVar10 = local_100;
            if (0 < (int)uVar7) {
              lVar19 = local_108 * local_168;
              uVar22 = 0;
              do {
                if (uVar8 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = 0.0;
                  uVar18 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar10 +
                                                (long)piVar6[uVar18] * 4 + uVar22 * 4 + lVar19);
                    uVar18 = uVar18 + 1;
                  } while (uVar13 + (uVar13 == 0) != uVar18);
                }
                fVar24 = powf(fVar24 * fVar1 * (1.0 / (float)(int)uVar13) +
                              (local_f0->super_LRN).bias,-(local_f0->super_LRN).beta);
                *(float *)((long)pvVar15 + uVar22 * 4) =
                     fVar24 * *(float *)((long)pvVar15 + uVar22 * 4);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar7);
            }
            pvVar15 = (void *)((long)pvVar15 + local_f8 * 4);
            local_168 = local_168 + 1;
          } while (local_168 != local_170);
        }
        local_110 = local_110 + 1;
      } while (local_110 != local_160);
    }
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar6);
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar14 = 0;
    if (piVar4 == (int *)0x0) goto LAB_00313101;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_00313101;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_00313101;
    }
  }
  iVar14 = 0;
  if (local_158.data != (void *)0x0) {
    iVar14 = 0;
    free(local_158.data);
  }
LAB_00313101:
  piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}